

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMaskUtil.cpp
# Opt level: O0

bool ZXing::QRCode::MaskUtil::HasPatternAt<4ul>
               (array<bool,_4UL> *pattern,Trit *begin,int count,int stride)

{
  const_iterator pvVar1;
  int in_ECX;
  int in_EDX;
  Trit *in_RSI;
  bool bVar2;
  const_iterator b;
  Trit *a;
  Trit *end;
  const_iterator local_38;
  Trit *local_30;
  Trit *local_28;
  int local_20;
  Trit *local_18 [3];
  
  local_28 = in_RSI + in_EDX * in_ECX;
  local_20 = in_ECX;
  local_18[0] = in_RSI;
  if (in_EDX < 0) {
    std::swap<ZXing::Trit_const*>(local_18,&local_28);
  }
  local_30 = local_18[0];
  local_38 = std::array<bool,_4UL>::begin((array<bool,_4UL> *)0x302be9);
  while( true ) {
    bVar2 = false;
    if (local_30 < local_28) {
      pvVar1 = std::array<bool,_4UL>::end((array<bool,_4UL> *)0x302c13);
      bVar2 = local_38 != pvVar1;
    }
    if (!bVar2) break;
    bVar2 = Trit::operator_cast_to_bool(local_30);
    if (bVar2 != (bool)(*local_38 & 1U)) {
      return false;
    }
    local_30 = local_30 + local_20;
    local_38 = local_38 + 1;
  }
  return true;
}

Assistant:

static bool HasPatternAt(const std::array<bool, N>& pattern, const Trit* begin, int count, int stride)
{
	assert(std::abs(count) <= (int)N);
	auto end = begin + count * stride;
	if (count < 0)
		std::swap(begin, end);
	auto a = begin;
	for (auto b = pattern.begin(); a < end && b != pattern.end(); a += stride, ++b)
		if (*a != *b)
			return false;
	return true;
}